

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
* toml::detail::parse_file<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  indent_char iVar1;
  int32_t iVar2;
  table_format_info fmt_00;
  table_format_info fmt_01;
  table_format_info fmt_02;
  table_format_info fmt_03;
  ulong uVar3;
  bool bVar4;
  table_format_info *ptVar5;
  string *title;
  size_type sVar6;
  multiline_spacer<toml::type_config> *pmVar7;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_RDX;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_RDI;
  bool maybe_array_of_tables;
  location keytop;
  result<toml::detail::none_t,_toml::error_info> tab_res_1;
  value_type tab_ptr_1;
  result<toml::detail::none_t,_toml::error_info> res_2;
  basic_value<toml::type_config> tmp_1;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> inserted_1;
  value_type tab_1;
  table_format_info fmt_1;
  value_type com_opt_2;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res_2;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  com_1;
  type reg_1;
  type key_1;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  key_res_1;
  result<toml::detail::none_t,_toml::error_info> tab_res;
  value_type tab_ptr;
  result<toml::detail::none_t,_toml::error_info> res_1;
  basic_value<toml::type_config> tmp;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> inserted;
  value_type tab;
  table_format_info fmt;
  value_type com_opt_1;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res_1;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  com;
  type reg;
  type key;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  key_res;
  optional<toml::detail::multiline_spacer<toml::type_config>_> sp;
  result<toml::detail::none_t,_toml::error_info> res;
  value_type com_opt;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  value_type root;
  spec *spec;
  location first;
  region *in_stack_ffffffffffffde88;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_stack_ffffffffffffde90;
  value_type *in_stack_ffffffffffffde98;
  either *in_stack_ffffffffffffdea0;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_stack_ffffffffffffdea8;
  region *in_stack_ffffffffffffdeb0;
  basic_value<toml::type_config> *in_stack_ffffffffffffdeb8;
  undefined7 in_stack_ffffffffffffdec0;
  byte in_stack_ffffffffffffdec7;
  either *in_stack_ffffffffffffdec8;
  undefined4 in_stack_ffffffffffffded0;
  uint32_t in_stack_ffffffffffffded4;
  spec *in_stack_ffffffffffffded8;
  undefined7 in_stack_ffffffffffffdee8;
  indent_char in_stack_ffffffffffffdeef;
  source_location in_stack_ffffffffffffdef0;
  location *in_stack_ffffffffffffdef8;
  region *in_stack_ffffffffffffdf00;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_stack_ffffffffffffdf08;
  region_type *in_stack_ffffffffffffdf18;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_stack_ffffffffffffdf20;
  error_type *in_stack_ffffffffffffdf28;
  basic_value<toml::type_config> *in_stack_ffffffffffffdf30;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_stack_ffffffffffffdf38;
  error_type *in_stack_ffffffffffffdf40;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_stack_ffffffffffffdf68;
  basic_value<toml::type_config> *in_stack_ffffffffffffdf70;
  undefined6 in_stack_ffffffffffffdf78;
  byte in_stack_ffffffffffffdf7e;
  byte in_stack_ffffffffffffdf7f;
  location *in_stack_ffffffffffffdf80;
  sequence *in_stack_ffffffffffffdf88;
  context<toml::type_config> *in_stack_ffffffffffffe008;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  *in_stack_ffffffffffffe010;
  byte local_1f91;
  string *in_stack_ffffffffffffe0e0;
  location *in_stack_ffffffffffffe0e8;
  either *in_stack_ffffffffffffe0f0;
  undefined1 in_stack_ffffffffffffe18f;
  context<toml::type_config> *in_stack_ffffffffffffe190;
  location *in_stack_ffffffffffffe198;
  region local_1de1;
  value_type local_1d51;
  context<toml::type_config> *in_stack_ffffffffffffe2e0;
  location *in_stack_ffffffffffffe2e8;
  context<toml::type_config> *in_stack_ffffffffffffe310;
  location *in_stack_ffffffffffffe318;
  context<toml::type_config> *in_stack_ffffffffffffe320;
  location *in_stack_ffffffffffffe328;
  region local_1c41;
  undefined1 local_1bc8 [135];
  byte local_1b41;
  undefined **local_1af8;
  result<toml::detail::none_t,_toml::error_info> local_1a98;
  undefined **local_1a38;
  value_type local_1a30;
  undefined **local_1a28;
  result<toml::detail::none_t,_toml::error_info> local_19c8;
  basic_value<toml::type_config> local_1968;
  undefined **local_1868;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> local_16d8;
  basic_value<toml::type_config> *in_stack_ffffffffffffe998;
  context<toml::type_config> *in_stack_ffffffffffffe9a0;
  location *in_stack_ffffffffffffe9a8;
  table_format_info local_14e0;
  undefined **local_14d0;
  allocator<char> local_1469 [144];
  basic_value<toml::type_config> local_13d9;
  undefined **local_12d0;
  result local_12a0 [96];
  ulong local_1240;
  undefined **local_1220;
  undefined **local_11b0;
  result local_1190 [136];
  undefined **local_1108;
  result<toml::detail::none_t,_toml::error_info> local_10a8;
  undefined **local_1048;
  value_type local_1040;
  undefined **local_1038;
  result<toml::detail::none_t,_toml::error_info> local_fd8;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined **local_e78;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> local_ce8 [2];
  undefined8 local_c08;
  int32_t iStack_c00;
  int32_t iStack_bfc;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  table_format_info local_af0;
  undefined **local_ae0;
  allocator<char> local_a79 [144];
  allocator<char> local_9e9 [127];
  byte local_96a;
  byte local_969;
  undefined **local_8e0;
  result local_8b0 [96];
  ulong local_850;
  undefined **local_830;
  undefined **local_7c0;
  result local_7a0 [176];
  undefined **local_6f0;
  result<toml::detail::none_t,_toml::error_info> local_690;
  undefined **local_630;
  undefined **local_510;
  result local_4e0 [200];
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined1 local_3f8;
  undefined1 uStack_3f7;
  undefined4 uStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  basic_value<toml::type_config> *in_stack_fffffffffffffcd8;
  region *in_stack_fffffffffffffce0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffce8;
  table_type *in_stack_fffffffffffffcf0;
  inserting_value_kind in_stack_fffffffffffffcff;
  int local_2e0;
  
  location::location((location *)in_stack_ffffffffffffdeb0,(location *)in_stack_ffffffffffffdea8);
  context<toml::type_config>::toml_spec((context<toml::type_config> *)in_RDX);
  bVar4 = location::eof((location *)in_stack_ffffffffffffde90);
  if (bVar4) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                     *)0x6bd71e);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x6bd778);
    region::region(in_stack_ffffffffffffdf00,in_stack_ffffffffffffdef8);
    fmt_00._8_8_ = in_stack_ffffffffffffdf40;
    fmt_00._0_8_ = in_stack_ffffffffffffdf38;
    basic_value<toml::type_config>::basic_value
              (in_stack_ffffffffffffdf30,(table_type *)in_stack_ffffffffffffdf28,fmt_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18);
    ok<toml::basic_value<toml::type_config>>
              ((basic_value<toml::type_config> *)
               CONCAT17(in_stack_ffffffffffffdf7f,
                        CONCAT16(in_stack_ffffffffffffdf7e,in_stack_ffffffffffffdf78)));
    result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
    ::result(in_stack_ffffffffffffde90,(success_type *)in_stack_ffffffffffffde88);
    success<toml::basic_value<toml::type_config>_>::~success
              ((success<toml::basic_value<toml::type_config>_> *)0x6bd801);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)in_stack_ffffffffffffde90);
    region::~region((region *)in_stack_ffffffffffffde90);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffdea0);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                      *)0x6bd835);
  }
  else {
    local_3c8 = 0;
    uStack_3c0 = 0;
    local_3d8 = 0;
    uStack_3d0 = 0;
    local_3e8 = 0;
    uStack_3e0 = 0;
    local_3b8 = 0;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                     *)0x6bd91d);
    local_3f8 = 0;
    uStack_3f7 = 0;
    uStack_3f4 = 0;
    local_3f0 = 0;
    uStack_3ec = 0;
    local_418 = 0;
    uStack_410 = 0;
    local_408 = 0;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x6bd977);
    region::region(in_stack_ffffffffffffdf00,in_stack_ffffffffffffdef8);
    fmt_01._8_8_ = in_stack_ffffffffffffdf40;
    fmt_01._0_8_ = in_stack_ffffffffffffdf38;
    basic_value<toml::type_config>::basic_value
              (in_stack_ffffffffffffdf30,(table_type *)in_stack_ffffffffffffdf28,fmt_01,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18);
    region::~region((region *)in_stack_ffffffffffffde90);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffdea0);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                      *)0x6bd9ec);
    ptVar5 = basic_value<toml::type_config>::as_table_fmt
                       ((basic_value<toml::type_config> *)
                        CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0));
    ptVar5->fmt = multiline;
    title = (string *)
            basic_value<toml::type_config>::as_table_fmt
                      ((basic_value<toml::type_config> *)
                       CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0));
    *(indent_char *)((long)&(title->_M_dataplus)._M_p + 1) = none;
    do {
      bVar4 = location::eof((location *)in_stack_ffffffffffffde90);
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      parse_comment_line<toml::type_config>(in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
      bVar4 = toml::result::operator_cast_to_bool(local_4e0);
      if (bVar4) {
        local_510 = &PTR_s__workspace_llm4binary_github_lic_009d5bd8;
        in_stack_ffffffffffffe0f0 =
             (either *)
             result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
             ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                      in_stack_ffffffffffffdef0);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffde90,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffde88);
        bVar4 = std::optional::operator_cast_to_bool
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x6bdad0);
        if (bVar4) {
          in_stack_ffffffffffffe0e0 =
               (string *)
               basic_value<toml::type_config>::comments
                         ((basic_value<toml::type_config> *)&stack0xfffffffffffffc58);
          in_stack_ffffffffffffe0e8 =
               (location *)
               std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffde90);
          preserve_comments::push_back
                    ((preserve_comments *)in_stack_ffffffffffffde90,
                     (string *)in_stack_ffffffffffffde88);
          local_2e0 = 0;
        }
        else {
          syntax::ws((spec *)in_stack_ffffffffffffdec8);
          syntax::newline(in_stack_ffffffffffffded8);
          sequence::sequence<toml::detail::repeat_at_least,toml::detail::either>
                    ((sequence *)in_stack_ffffffffffffdeb0,
                     (repeat_at_least *)in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0);
          sequence::scan(in_stack_ffffffffffffdf88,in_stack_ffffffffffffdf80);
          bVar4 = region::is_ok((region *)0x6bdc3b);
          region::~region((region *)in_stack_ffffffffffffde90);
          sequence::~sequence((sequence *)in_stack_ffffffffffffde90);
          either::~either((either *)in_stack_ffffffffffffde90);
          repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_ffffffffffffde90);
          if (((bVar4 ^ 0xffU) & 1) != 0) {
            location::operator=((location *)in_stack_ffffffffffffde90,
                                (location *)in_stack_ffffffffffffde88);
            basic_value<toml::type_config>::comments
                      ((basic_value<toml::type_config> *)&stack0xfffffffffffffc58);
            preserve_comments::clear((preserve_comments *)0x6bdcb4);
          }
          local_2e0 = 3;
        }
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x6bdd46);
        if (local_2e0 == 0) goto LAB_006bde29;
      }
      else {
        local_630 = &PTR_s__workspace_llm4binary_github_lic_009d5bf0;
        result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
        ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                     in_stack_ffffffffffffdef0);
        error_info::error_info
                  ((error_info *)in_stack_ffffffffffffde90,(error_info *)in_stack_ffffffffffffde88);
        context<toml::type_config>::report_error
                  ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                   (error_info *)in_stack_ffffffffffffde88);
        error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
        skip_comment_block<toml::type_config>
                  ((location *)in_stack_ffffffffffffdf30,
                   (context<toml::type_config> *)in_stack_ffffffffffffdf28);
LAB_006bde29:
        local_2e0 = 0;
      }
      result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
      ::~result((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                 *)0x6bde41);
    } while (local_2e0 == 0);
    parse_table<toml::type_config>
              (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
    bVar4 = result<toml::detail::none_t,_toml::error_info>::is_err(&local_690);
    if (bVar4) {
      local_6f0 = &PTR_s__workspace_llm4binary_github_lic_009d5c08;
      result<toml::detail::none_t,_toml::error_info>::unwrap_err
                ((result<toml::detail::none_t,_toml::error_info> *)
                 CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                 in_stack_ffffffffffffdef0);
      error_info::error_info
                ((error_info *)in_stack_ffffffffffffdeb0,(error_info *)in_stack_ffffffffffffdea8);
      context<toml::type_config>::report_error
                ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                 (error_info *)in_stack_ffffffffffffde88);
      error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
      skip_until_next_table<toml::type_config>
                ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
    }
    result<toml::detail::none_t,_toml::error_info>::~result
              ((result<toml::detail::none_t,_toml::error_info> *)0x6bdf82);
    while (bVar4 = location::eof((location *)in_stack_ffffffffffffde90), ((bVar4 ^ 0xffU) & 1) != 0)
    {
      skip_multiline_spacer<toml::type_config>
                (in_stack_ffffffffffffe198,in_stack_ffffffffffffe190,(bool)in_stack_ffffffffffffe18f
                );
      parse_array_table_key<toml::type_config>(in_stack_ffffffffffffe328,in_stack_ffffffffffffe320);
      bVar4 = toml::result::operator_cast_to_bool(local_7a0);
      if (bVar4) {
        local_7c0 = &PTR_s__workspace_llm4binary_github_lic_009d5c20;
        result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
        ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                  *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                 in_stack_ffffffffffffdef0);
        std::
        get<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>
                  ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                    *)0x6be02e);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffde90,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffde88);
        local_830 = &PTR_s__workspace_llm4binary_github_lic_009d5c38;
        result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
        ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                  *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                 in_stack_ffffffffffffdef0);
        std::
        get<1ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>
                  ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                    *)0x6be079);
        region::region((region *)in_stack_ffffffffffffde90,in_stack_ffffffffffffde88);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x6be096);
        bVar4 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                          ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x6be0a3)
        ;
        if (bVar4) {
          local_850 = 0;
          while( true ) {
            uVar3 = local_850;
            std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                      ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                       in_stack_ffffffffffffde90);
            sVar6 = preserve_comments::size((preserve_comments *)0x6be0f0);
            if (sVar6 <= uVar3) break;
            std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                      ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                       in_stack_ffffffffffffde90);
            preserve_comments::at_abi_cxx11_
                      ((preserve_comments *)in_stack_ffffffffffffde90,
                       (size_type)in_stack_ffffffffffffde88);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffde90,(value_type *)in_stack_ffffffffffffde88);
            local_850 = local_850 + 1;
          }
        }
        parse_comment_line<toml::type_config>(in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0);
        bVar4 = toml::result::operator_cast_to_bool(local_8b0);
        if (bVar4) {
          local_8e0 = &PTR_s__workspace_llm4binary_github_lic_009d5c50;
          result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
          ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                   in_stack_ffffffffffffdef0);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffde90,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffde88);
          bVar4 = std::optional::operator_cast_to_bool
                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x6be26f);
          if (bVar4) {
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffde90);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
LAB_006be65f:
            bVar4 = false;
          }
          else {
            skip_whitespace<toml::type_config>
                      ((location *)in_stack_ffffffffffffdf30,
                       (context<toml::type_config> *)in_stack_ffffffffffffdf28);
            bVar4 = location::eof((location *)in_stack_ffffffffffffde90);
            local_969 = 0;
            local_96a = 0;
            local_1f91 = 0;
            if (!bVar4) {
              context<toml::type_config>::toml_spec((context<toml::type_config> *)in_RDX);
              syntax::newline(in_stack_ffffffffffffded8);
              local_969 = 1;
              either::scan(in_stack_ffffffffffffdec8,
                           (location *)CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0)
                          );
              local_96a = 1;
              bVar4 = region::is_ok((region *)0x6be379);
              local_1f91 = bVar4 ^ 0xff;
            }
            if ((local_96a & 1) != 0) {
              region::~region((region *)in_stack_ffffffffffffde90);
            }
            if ((local_969 & 1) != 0) {
              either::~either((either *)in_stack_ffffffffffffde90);
            }
            if ((local_1f91 & 1) == 0) goto LAB_006be65f;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0),
                       (char *)in_stack_ffffffffffffdec8,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0));
            context<toml::type_config>::toml_spec((context<toml::type_config> *)in_RDX);
            syntax::newline(in_stack_ffffffffffffded8);
            location::location((location *)in_stack_ffffffffffffdeb0,
                               (location *)in_stack_ffffffffffffdea8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0),
                       (char *)in_stack_ffffffffffffdec8,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0));
            make_syntax_error<toml::detail::either>
                      (title,in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,
                       in_stack_ffffffffffffe0e0);
            context<toml::type_config>::report_error
                      ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                       (error_info *)in_stack_ffffffffffffde88);
            error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffde90);
            std::allocator<char>::~allocator(local_a79);
            location::~location((location *)in_stack_ffffffffffffde90);
            either::~either((either *)in_stack_ffffffffffffde90);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffde90);
            std::allocator<char>::~allocator(local_9e9);
            skip_until_next_table<toml::type_config>
                      ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
            bVar4 = true;
          }
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x6be677);
          if (!bVar4) {
            bVar4 = false;
          }
        }
        else {
          local_ae0 = &PTR_s__workspace_llm4binary_github_lic_009d5c68;
          result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
          ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                       in_stack_ffffffffffffdef0);
          error_info::error_info
                    ((error_info *)in_stack_ffffffffffffdeb0,(error_info *)in_stack_ffffffffffffdea8
                    );
          context<toml::type_config>::report_error
                    ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                     (error_info *)in_stack_ffffffffffffde88);
          error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
          skip_until_next_table<toml::type_config>
                    ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
          bVar4 = true;
        }
        result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
        ::~result((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                   *)0x6be77a);
        if (!bVar4) {
          table_format_info::table_format_info(&local_af0);
          local_af0.fmt = multiline;
          local_af0.indent_type = none;
          local_bd8 = 0;
          uStack_bd0 = 0;
          local_be8 = 0;
          uStack_be0 = 0;
          local_bf8 = 0;
          uStack_bf0 = 0;
          local_bc8 = 0;
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
          ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                           *)0x6be7dc);
          local_c08 = CONCAT62(local_af0._2_6_,CONCAT11(local_af0.indent_type,local_af0.fmt));
          iStack_c00 = local_af0.name_indent;
          iStack_bfc = local_af0.closing_indent;
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffde90,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffde88);
          region::region(in_stack_ffffffffffffdeb0,(region *)in_stack_ffffffffffffdea8);
          fmt_02._8_8_ = in_stack_ffffffffffffdf40;
          fmt_02._0_8_ = in_stack_ffffffffffffdf38;
          basic_value<toml::type_config>::basic_value
                    (in_stack_ffffffffffffdf30,(table_type *)in_stack_ffffffffffffdf28,fmt_02,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18);
          region::~region((region *)in_stack_ffffffffffffde90);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffdea0);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
          ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                            *)0x6be876);
          basic_value<toml::type_config>::as_table_abi_cxx11_
                    ((basic_value<toml::type_config> *)
                     CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0));
          region::region((region *)in_stack_ffffffffffffde90,in_stack_ffffffffffffde88);
          basic_value<toml::type_config>::basic_value
                    ((basic_value<toml::type_config> *)
                     CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0),
                     in_stack_ffffffffffffdeb8);
          insert_value<toml::type_config>
                    (in_stack_fffffffffffffcff,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          basic_value<toml::type_config>::~basic_value
                    ((basic_value<toml::type_config> *)in_stack_ffffffffffffde90);
          region::~region((region *)in_stack_ffffffffffffde90);
          bVar4 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::is_err
                            (local_ce8);
          if (bVar4) {
            local_e78 = &PTR_s__workspace_llm4binary_github_lic_009d5c80;
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                       CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                       in_stack_ffffffffffffdef0);
            error_info::error_info
                      ((error_info *)in_stack_ffffffffffffdeb0,
                       (error_info *)in_stack_ffffffffffffdea8);
            context<toml::type_config>::report_error
                      ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                       (error_info *)in_stack_ffffffffffffde88);
            error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
            local_f58 = 0;
            uStack_f50 = 0;
            local_f68 = 0;
            uStack_f60 = 0;
            local_f78 = 0;
            uStack_f70 = 0;
            local_f48 = 0;
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
            ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                             *)0x6be9d2);
            basic_value<toml::type_config>::basic_value
                      (in_stack_ffffffffffffdf70,(table_type *)in_stack_ffffffffffffdf68);
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
            ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                              *)0x6be9f6);
            parse_table<toml::type_config>
                      (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998
                      );
            bVar4 = result<toml::detail::none_t,_toml::error_info>::is_err(&local_fd8);
            if (bVar4) {
              local_1038 = &PTR_s__workspace_llm4binary_github_lic_009d5c98;
              in_stack_ffffffffffffe010 = in_RDX;
              result<toml::detail::none_t,_toml::error_info>::unwrap_err
                        ((result<toml::detail::none_t,_toml::error_info> *)
                         CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                         in_stack_ffffffffffffdef0);
              error_info::error_info
                        ((error_info *)in_stack_ffffffffffffdeb0,
                         (error_info *)in_stack_ffffffffffffdea8);
              context<toml::type_config>::report_error
                        ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                         (error_info *)in_stack_ffffffffffffde88);
              error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
              skip_until_next_table<toml::type_config>
                        ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
            }
            result<toml::detail::none_t,_toml::error_info>::~result
                      ((result<toml::detail::none_t,_toml::error_info> *)0x6bec5e);
            basic_value<toml::type_config>::~basic_value
                      ((basic_value<toml::type_config> *)in_stack_ffffffffffffde90);
          }
          else {
            local_1048 = &PTR_s__workspace_llm4binary_github_lic_009d5cb0;
            in_stack_ffffffffffffe008 =
                 (context<toml::type_config> *)
                 result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                           ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                            CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                            in_stack_ffffffffffffdef0);
            local_1040 = *(value_type *)&(in_stack_ffffffffffffe008->toml_spec_).version;
            parse_table<toml::type_config>
                      (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998
                      );
            bVar4 = result<toml::detail::none_t,_toml::error_info>::is_err(&local_10a8);
            if (bVar4) {
              local_1108 = &PTR_s__workspace_llm4binary_github_lic_009d5cc8;
              result<toml::detail::none_t,_toml::error_info>::unwrap_err
                        ((result<toml::detail::none_t,_toml::error_info> *)
                         CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                         in_stack_ffffffffffffdef0);
              error_info::error_info
                        ((error_info *)in_stack_ffffffffffffdeb0,
                         (error_info *)in_stack_ffffffffffffdea8);
              context<toml::type_config>::report_error
                        ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                         (error_info *)in_stack_ffffffffffffde88);
              error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
              skip_until_next_table<toml::type_config>
                        ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
            }
            bVar4 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                               0x6bedeb);
            if ((bVar4) &&
               (pmVar7 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                   ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                    in_stack_ffffffffffffde90), pmVar7->indent_type != none)) {
              pmVar7 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                 ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                  in_stack_ffffffffffffde90);
              iVar1 = pmVar7->indent_type;
              ptVar5 = basic_value<toml::type_config>::as_table_fmt
                                 ((basic_value<toml::type_config> *)
                                  CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0));
              ptVar5->indent_type = iVar1;
              pmVar7 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                 ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                  in_stack_ffffffffffffde90);
              iVar2 = pmVar7->indent;
              ptVar5 = basic_value<toml::type_config>::as_table_fmt
                                 ((basic_value<toml::type_config> *)
                                  CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0));
              ptVar5->name_indent = iVar2;
            }
            result<toml::detail::none_t,_toml::error_info>::~result
                      ((result<toml::detail::none_t,_toml::error_info> *)0x6beed9);
          }
          bVar4 = true;
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::~result
                    ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)0x6beef7);
          basic_value<toml::type_config>::~basic_value
                    ((basic_value<toml::type_config> *)in_stack_ffffffffffffde90);
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffdea0);
        region::~region((region *)in_stack_ffffffffffffde90);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffdea0);
      }
      else {
        bVar4 = false;
      }
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::~result((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                 *)0x6bef8f);
      if (!bVar4) {
        parse_table_key<toml::type_config>(in_stack_ffffffffffffe318,in_stack_ffffffffffffe310);
        bVar4 = toml::result::operator_cast_to_bool(local_1190);
        if (bVar4) {
          local_11b0 = &PTR_s__workspace_llm4binary_github_lic_009d5ce0;
          result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
          ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                    *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                   in_stack_ffffffffffffdef0);
          std::
          get<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>
                    ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                      *)0x6bf010);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffde90,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffde88);
          local_1220 = &PTR_s__workspace_llm4binary_github_lic_009d5cf8;
          result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
          ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                    *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                   in_stack_ffffffffffffdef0);
          std::
          get<1ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>
                    ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
                      *)0x6bf05b);
          region::region((region *)in_stack_ffffffffffffde90,in_stack_ffffffffffffde88);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x6bf078);
          bVar4 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                            ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                             0x6bf085);
          if (bVar4) {
            local_1240 = 0;
            while( true ) {
              uVar3 = local_1240;
              std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                        ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                         in_stack_ffffffffffffde90);
              sVar6 = preserve_comments::size((preserve_comments *)0x6bf0d2);
              if (sVar6 <= uVar3) break;
              std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                        ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                         in_stack_ffffffffffffde90);
              preserve_comments::at_abi_cxx11_
                        ((preserve_comments *)in_stack_ffffffffffffde90,
                         (size_type)in_stack_ffffffffffffde88);
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffde90,(value_type *)in_stack_ffffffffffffde88);
              local_1240 = local_1240 + 1;
            }
          }
          parse_comment_line<toml::type_config>(in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e0)
          ;
          bVar4 = toml::result::operator_cast_to_bool(local_12a0);
          if (bVar4) {
            local_12d0 = &PTR_s__workspace_llm4binary_github_lic_009d5d10;
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                      *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                     in_stack_ffffffffffffdef0);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffde90,
                       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffde88);
            bVar4 = std::optional::operator_cast_to_bool
                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x6bf238);
            if (bVar4) {
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_ffffffffffffde90);
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
LAB_006bf628:
              bVar4 = false;
            }
            else {
              skip_whitespace<toml::type_config>
                        ((location *)in_stack_ffffffffffffdf30,
                         (context<toml::type_config> *)in_stack_ffffffffffffdf28);
              bVar4 = location::eof((location *)in_stack_ffffffffffffde90);
              local_13d9.region_.first_._0_1_ = 0;
              local_13d9.region_.length_._7_1_ = 0;
              in_stack_ffffffffffffdf7e = 0;
              if (!bVar4) {
                context<toml::type_config>::toml_spec((context<toml::type_config> *)in_RDX);
                syntax::newline(in_stack_ffffffffffffded8);
                local_13d9.region_.first_._0_1_ = 1;
                either::scan(in_stack_ffffffffffffdec8,
                             (location *)
                             CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0));
                local_13d9.region_.length_._7_1_ = 1;
                bVar4 = region::is_ok((region *)0x6bf342);
                in_stack_ffffffffffffdf7e = bVar4 ^ 0xff;
              }
              in_stack_ffffffffffffdf7f = in_stack_ffffffffffffdf7e;
              if ((local_13d9.region_.length_._7_1_ & 1) != 0) {
                region::~region((region *)in_stack_ffffffffffffde90);
              }
              if (((byte)local_13d9.region_.first_ & 1) != 0) {
                either::~either((either *)in_stack_ffffffffffffde90);
              }
              if ((in_stack_ffffffffffffdf7e & 1) == 0) goto LAB_006bf628;
              in_stack_ffffffffffffdf70 = &local_13d9;
              in_stack_ffffffffffffdf68 = in_RDX;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0),
                         (char *)in_stack_ffffffffffffdec8,
                         (allocator<char> *)
                         CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0));
              context<toml::type_config>::toml_spec((context<toml::type_config> *)in_RDX);
              syntax::newline(in_stack_ffffffffffffded8);
              location::location((location *)in_stack_ffffffffffffdeb0,
                                 (location *)in_stack_ffffffffffffdea8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0),
                         (char *)in_stack_ffffffffffffdec8,
                         (allocator<char> *)
                         CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0));
              make_syntax_error<toml::detail::either>
                        (title,in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,
                         in_stack_ffffffffffffe0e0);
              context<toml::type_config>::report_error
                        ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                         (error_info *)in_stack_ffffffffffffde88);
              error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffde90);
              std::allocator<char>::~allocator(local_1469);
              location::~location((location *)in_stack_ffffffffffffde90);
              either::~either((either *)in_stack_ffffffffffffde90);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffde90);
              std::allocator<char>::~allocator((allocator<char> *)&local_13d9);
              skip_until_next_table<toml::type_config>
                        ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
              bVar4 = true;
            }
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x6bf640);
            if (!bVar4) {
              bVar4 = false;
            }
          }
          else {
            local_14d0 = &PTR_s__workspace_llm4binary_github_lic_009d5d28;
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                          *)CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                         in_stack_ffffffffffffdef0);
            error_info::error_info
                      ((error_info *)in_stack_ffffffffffffdeb0,
                       (error_info *)in_stack_ffffffffffffdea8);
            context<toml::type_config>::report_error
                      ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                       (error_info *)in_stack_ffffffffffffde88);
            error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
            skip_until_next_table<toml::type_config>
                      ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
            bVar4 = true;
          }
          result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
          ::~result((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                     *)0x6bf743);
          if (!bVar4) {
            table_format_info::table_format_info(&local_14e0);
            local_14e0.fmt = multiline;
            local_14e0.indent_type = none;
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
            ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                             *)0x6bf7a5);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffde90,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffde88);
            region::region(in_stack_ffffffffffffdeb0,(region *)in_stack_ffffffffffffdea8);
            fmt_03._8_8_ = in_stack_ffffffffffffdf40;
            fmt_03._0_8_ = in_stack_ffffffffffffdf38;
            basic_value<toml::type_config>::basic_value
                      (in_stack_ffffffffffffdf30,(table_type *)in_stack_ffffffffffffdf28,fmt_03,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18);
            region::~region((region *)in_stack_ffffffffffffde90);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffdea0);
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
            ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                              *)0x6bf83f);
            basic_value<toml::type_config>::as_table_abi_cxx11_
                      ((basic_value<toml::type_config> *)
                       CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0));
            region::region((region *)in_stack_ffffffffffffde90,in_stack_ffffffffffffde88);
            basic_value<toml::type_config>::basic_value
                      ((basic_value<toml::type_config> *)
                       CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0),
                       in_stack_ffffffffffffdeb8);
            insert_value<toml::type_config>
                      (in_stack_fffffffffffffcff,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8
                       ,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            basic_value<toml::type_config>::~basic_value
                      ((basic_value<toml::type_config> *)in_stack_ffffffffffffde90);
            region::~region((region *)in_stack_ffffffffffffde90);
            bVar4 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::is_err
                              (&local_16d8);
            if (bVar4) {
              local_1868 = &PTR_s__workspace_llm4binary_github_lic_009d5d40;
              in_stack_ffffffffffffdf38 = in_RDX;
              in_stack_ffffffffffffdf40 =
                   result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                             ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                              CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                              in_stack_ffffffffffffdef0);
              error_info::error_info
                        ((error_info *)in_stack_ffffffffffffdeb0,
                         (error_info *)in_stack_ffffffffffffdea8);
              context<toml::type_config>::report_error
                        ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                         (error_info *)in_stack_ffffffffffffde88);
              error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
              local_1968.field_1.integer_.format.spacer = 0;
              local_1968.field_1.floating_.format.suffix._M_string_length = 0;
              local_1968.field_1.string_.value._M_string_length = 0;
              local_1968.field_1.integer_.format.width = 0;
              local_1968.type_ = empty;
              local_1968._1_7_ = 0;
              local_1968.field_1.integer_.value = 0;
              local_1968.field_1.integer_.format.suffix._M_string_length = 0;
              in_stack_ffffffffffffdf30 = &local_1968;
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
              ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                               *)0x6bf998);
              basic_value<toml::type_config>::basic_value
                        (in_stack_ffffffffffffdf70,(table_type *)in_stack_ffffffffffffdf68);
              std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
              ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                                *)0x6bf9bc);
              parse_table<toml::type_config>
                        (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0,
                         in_stack_ffffffffffffe998);
              bVar4 = result<toml::detail::none_t,_toml::error_info>::is_err(&local_19c8);
              if (bVar4) {
                local_1a28 = &PTR_s__workspace_llm4binary_github_lic_009d5d58;
                in_stack_ffffffffffffdf20 = in_RDX;
                in_stack_ffffffffffffdf28 =
                     result<toml::detail::none_t,_toml::error_info>::unwrap_err
                               ((result<toml::detail::none_t,_toml::error_info> *)
                                CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                                in_stack_ffffffffffffdef0);
                error_info::error_info
                          ((error_info *)in_stack_ffffffffffffdeb0,
                           (error_info *)in_stack_ffffffffffffdea8);
                context<toml::type_config>::report_error
                          ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                           (error_info *)in_stack_ffffffffffffde88);
                error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
                skip_until_next_table<toml::type_config>
                          ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
              }
              result<toml::detail::none_t,_toml::error_info>::~result
                        ((result<toml::detail::none_t,_toml::error_info> *)0x6bfc24);
              basic_value<toml::type_config>::~basic_value
                        ((basic_value<toml::type_config> *)in_stack_ffffffffffffde90);
            }
            else {
              local_1a38 = &PTR_s__workspace_llm4binary_github_lic_009d5d70;
              in_stack_ffffffffffffdf18 =
                   (region_type *)
                   result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                             ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                              CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                              in_stack_ffffffffffffdef0);
              local_1a30 = (value_type)
                           (in_stack_ffffffffffffdf18->source_).
                           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
              parse_table<toml::type_config>
                        (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0,
                         in_stack_ffffffffffffe998);
              bVar4 = result<toml::detail::none_t,_toml::error_info>::is_err(&local_1a98);
              if (bVar4) {
                local_1af8 = &PTR_s__workspace_llm4binary_github_lic_009d5d88;
                in_stack_ffffffffffffdf08 = in_RDX;
                result<toml::detail::none_t,_toml::error_info>::unwrap_err
                          ((result<toml::detail::none_t,_toml::error_info> *)
                           CONCAT17(in_stack_ffffffffffffdeef,in_stack_ffffffffffffdee8),
                           in_stack_ffffffffffffdef0);
                error_info::error_info
                          ((error_info *)in_stack_ffffffffffffdeb0,
                           (error_info *)in_stack_ffffffffffffdea8);
                context<toml::type_config>::report_error
                          ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                           (error_info *)in_stack_ffffffffffffde88);
                error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
                skip_until_next_table<toml::type_config>
                          ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
              }
              bVar4 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                 0x6bfdb1);
              if ((bVar4) &&
                 (in_stack_ffffffffffffdf00 =
                       (region *)
                       std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                 ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                  in_stack_ffffffffffffde90),
                 *(indent_char *)
                  ((long)&(in_stack_ffffffffffffdf00->source_).
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 1) != none)) {
                pmVar7 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                   ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                    in_stack_ffffffffffffde90);
                in_stack_ffffffffffffdeef = pmVar7->indent_type;
                in_stack_ffffffffffffdef0._M_impl =
                     (__impl *)
                     basic_value<toml::type_config>::as_table_fmt
                               ((basic_value<toml::type_config> *)
                                CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0));
                *(indent_char *)((long)&(in_stack_ffffffffffffdef0._M_impl)->_M_file_name + 1) =
                     in_stack_ffffffffffffdeef;
                pmVar7 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                   ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                    in_stack_ffffffffffffde90);
                in_stack_ffffffffffffded4 = pmVar7->indent;
                in_stack_ffffffffffffded8 =
                     (spec *)basic_value<toml::type_config>::as_table_fmt
                                       ((basic_value<toml::type_config> *)
                                        CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0
                                                ));
                (in_stack_ffffffffffffded8->version).patch = in_stack_ffffffffffffded4;
              }
              result<toml::detail::none_t,_toml::error_info>::~result
                        ((result<toml::detail::none_t,_toml::error_info> *)0x6bfe75);
            }
            bVar4 = true;
            result<toml::basic_value<toml::type_config>_*,_toml::error_info>::~result
                      ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)0x6bfe93)
            ;
            basic_value<toml::type_config>::~basic_value
                      ((basic_value<toml::type_config> *)in_stack_ffffffffffffde90);
          }
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffdea0);
          region::~region((region *)in_stack_ffffffffffffde90);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffdea0);
        }
        else {
          bVar4 = false;
        }
        result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
        ::~result((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                   *)0x6bff2b);
        if (!bVar4) {
          location::location((location *)in_stack_ffffffffffffdeb0,
                             (location *)in_stack_ffffffffffffdea8);
          in_stack_ffffffffffffdec8 = (either *)local_1bc8;
          literal::literal<3ul>
                    ((literal *)in_stack_ffffffffffffde90,(char (*) [3])in_stack_ffffffffffffde88);
          literal::scan((literal *)in_stack_ffffffffffffdf08,(location *)in_stack_ffffffffffffdf00);
          in_stack_ffffffffffffdeb8 = (basic_value<toml::type_config> *)(local_1bc8 + 0x18);
          in_stack_ffffffffffffdec7 = region::is_ok((region *)0x6bff9a);
          region::~region((region *)in_stack_ffffffffffffde90);
          literal::~literal((literal *)0x6bffb5);
          local_1b41 = in_stack_ffffffffffffdec7;
          location::operator=((location *)in_stack_ffffffffffffde90,
                              (location *)in_stack_ffffffffffffde88);
          if ((local_1b41 & 1) == 0) {
            in_stack_ffffffffffffde98 = &local_1d51;
            in_stack_ffffffffffffde90 = in_RDX;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0),
                       (char *)in_stack_ffffffffffffdec8,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0));
            syntax::std_table((spec *)in_stack_ffffffffffffdf28);
            location::location((location *)in_stack_ffffffffffffdeb0,
                               (location *)in_stack_ffffffffffffdea8);
            in_stack_ffffffffffffde88 = &local_1de1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0),
                       (char *)in_stack_ffffffffffffdec8,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0));
            make_syntax_error<toml::detail::sequence>
                      (title,(sequence *)in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,
                       in_stack_ffffffffffffe0e0);
            context<toml::type_config>::report_error
                      ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                       (error_info *)in_stack_ffffffffffffde88);
            error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffde90);
            std::allocator<char>::~allocator((allocator<char> *)&local_1de1);
            location::~location((location *)in_stack_ffffffffffffde90);
            sequence::~sequence((sequence *)in_stack_ffffffffffffde90);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffde90);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d51);
          }
          else {
            in_stack_ffffffffffffdeb0 = &local_1c41;
            in_stack_ffffffffffffdea8 = in_RDX;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0),
                       (char *)in_stack_ffffffffffffdec8,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0));
            syntax::array_table((spec *)in_stack_ffffffffffffdf38);
            location::location((location *)in_stack_ffffffffffffdeb0,
                               (location *)in_stack_ffffffffffffdea8);
            in_stack_ffffffffffffdea0 = (either *)&stack0xffffffffffffe32f;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffded4,in_stack_ffffffffffffded0),
                       (char *)in_stack_ffffffffffffdec8,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffdec7,in_stack_ffffffffffffdec0));
            make_syntax_error<toml::detail::sequence>
                      (title,(sequence *)in_stack_ffffffffffffe0f0,in_stack_ffffffffffffe0e8,
                       in_stack_ffffffffffffe0e0);
            context<toml::type_config>::report_error
                      ((context<toml::type_config> *)in_stack_ffffffffffffde90,
                       (error_info *)in_stack_ffffffffffffde88);
            error_info::~error_info((error_info *)in_stack_ffffffffffffde90);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffde90);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffe32f);
            location::~location((location *)in_stack_ffffffffffffde90);
            sequence::~sequence((sequence *)in_stack_ffffffffffffde90);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffde90);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c41);
          }
          skip_until_next_table<toml::type_config>
                    ((location *)in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
          location::~location((location *)in_stack_ffffffffffffde90);
        }
      }
      std::optional<toml::detail::multiline_spacer<toml::type_config>_>::~optional
                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x6c04ad);
    }
    context<toml::type_config>::errors((context<toml::type_config> *)in_RDX);
    bVar4 = std::vector<toml::error_info,_std::allocator<toml::error_info>_>::empty
                      ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)
                       in_stack_ffffffffffffdea0);
    if (bVar4) {
      ok<toml::basic_value<toml::type_config>>
                ((basic_value<toml::type_config> *)
                 CONCAT17(in_stack_ffffffffffffdf7f,
                          CONCAT16(in_stack_ffffffffffffdf7e,in_stack_ffffffffffffdf78)));
      result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
      ::result(in_stack_ffffffffffffde90,(success_type *)in_stack_ffffffffffffde88);
      success<toml::basic_value<toml::type_config>_>::~success
                ((success<toml::basic_value<toml::type_config>_> *)0x6c05ad);
    }
    else {
      context<toml::type_config>::errors((context<toml::type_config> *)in_RDX);
      err<std::vector<toml::error_info,std::allocator<toml::error_info>>const>
                ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)
                 in_stack_ffffffffffffdea8);
      result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
      ::result(in_stack_ffffffffffffde90,(failure_type *)in_stack_ffffffffffffde88);
      failure<std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>::~failure
                ((failure<std::vector<toml::error_info,_std::allocator<toml::error_info>_>_> *)
                 0x6c053f);
    }
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)in_stack_ffffffffffffde90);
  }
  location::~location((location *)in_stack_ffffffffffffde90);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, std::vector<error_info>>
parse_file(location& loc, context<TC>& ctx)
{
    using value_type = basic_value<TC>;
    using table_type = typename value_type::table_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    if(loc.eof())
    {
        return ok(value_type(table_type(), table_format_info{}, {}, region(loc)));
    }

    value_type root(table_type(), table_format_info{}, {}, region(loc));
    root.as_table_fmt().fmt = table_format::multiline;
    root.as_table_fmt().indent_type = indent_char::none;

    // parse top comment.
    //
    // ```toml
    // # this is a comment for the top-level table.
    //
    // key = "the first value"
    // ```
    //
    // ```toml
    // # this is a comment for "the first value".
    // key = "the first value"
    // ```
    while( ! loc.eof())
    {
        if(auto com_res = parse_comment_line(loc, ctx))
        {
            if(auto com_opt = com_res.unwrap())
            {
                root.comments().push_back(std::move(com_opt.value()));
            }
            else // no comment found.
            {
                // if it is not an empty line, clear the root comment.
                if( ! sequence(syntax::ws(spec), syntax::newline(spec)).scan(loc).is_ok())
                {
                    loc = first;
                    root.comments().clear();
                }
                break;
            }
        }
        else
        {
            ctx.report_error(std::move(com_res.unwrap_err()));
            skip_comment_block(loc, ctx);
        }
    }

    // parse root table
    {
        const auto res = parse_table(loc, ctx, root);
        if(res.is_err())
        {
            ctx.report_error(std::move(res.unwrap_err()));
            skip_until_next_table(loc, ctx);
        }
    }

    // parse tables

    while( ! loc.eof())
    {
        auto sp = skip_multiline_spacer(loc, ctx, /*newline_found=*/true);

        if(auto key_res = parse_array_table_key(loc, ctx))
        {
            auto key = std::move(std::get<0>(key_res.unwrap()));
            auto reg = std::move(std::get<1>(key_res.unwrap()));

            std::vector<std::string> com;
            if(sp.has_value())
            {
                for(std::size_t i=0; i<sp.value().comments.size(); ++i)
                {
                    com.push_back(std::move(sp.value().comments.at(i)));
                }
            }

            // [table.def] must be followed by one of
            // - a comment line
            // - whitespace + newline
            // - EOF
            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    com.push_back(com_opt.value());
                }
                else // if there is no comment, ws+newline must exist (or EOF)
                {
                    skip_whitespace(loc, ctx);
                    if( ! loc.eof() && ! syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
                    {
                        ctx.report_error(make_syntax_error("toml::parse_file: "
                            "newline (or EOF) expected",
                            syntax::newline(ctx.toml_spec()), loc));
                        skip_until_next_table(loc, ctx);
                        continue;
                    }
                }
            }
            else // comment syntax error (rare)
            {
                ctx.report_error(com_res.unwrap_err());
                skip_until_next_table(loc, ctx);
                continue;
            }

            table_format_info fmt;
            fmt.fmt = table_format::multiline;
            fmt.indent_type = indent_char::none;
            auto tab = value_type(table_type{}, std::move(fmt), std::move(com), reg);

            auto inserted = insert_value(inserting_value_kind::array_table,
                std::addressof(root.as_table()),
                key, std::move(reg), std::move(tab));

            if(inserted.is_err())
            {
                ctx.report_error(inserted.unwrap_err());

                // check errors in the table
                auto tmp = basic_value<TC>(table_type());
                auto res = parse_table(loc, ctx, tmp);
                if(res.is_err())
                {
                    ctx.report_error(res.unwrap_err());
                    skip_until_next_table(loc, ctx);
                }
                continue;
            }

            auto tab_ptr = inserted.unwrap();
            assert(tab_ptr);

            const auto tab_res = parse_table(loc, ctx, *tab_ptr);
            if(tab_res.is_err())
            {
                ctx.report_error(tab_res.unwrap_err());
                skip_until_next_table(loc, ctx);
            }

            // parse_table first clears `indent_type`.
            // to keep header indent info, we must store it later.
            if(sp.has_value() && sp.value().indent_type != indent_char::none)
            {
                tab_ptr->as_table_fmt().indent_type = sp.value().indent_type;
                tab_ptr->as_table_fmt().name_indent = sp.value().indent;
            }
            continue;
        }
        if(auto key_res = parse_table_key(loc, ctx))
        {
            auto key = std::move(std::get<0>(key_res.unwrap()));
            auto reg = std::move(std::get<1>(key_res.unwrap()));

            std::vector<std::string> com;
            if(sp.has_value())
            {
                for(std::size_t i=0; i<sp.value().comments.size(); ++i)
                {
                    com.push_back(std::move(sp.value().comments.at(i)));
                }
            }

            // [table.def] must be followed by one of
            // - a comment line
            // - whitespace + newline
            // - EOF
            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    com.push_back(com_opt.value());
                }
                else // if there is no comment, ws+newline must exist (or EOF)
                {
                    skip_whitespace(loc, ctx);
                    if( ! loc.eof() && ! syntax::newline(ctx.toml_spec()).scan(loc).is_ok())
                    {
                        ctx.report_error(make_syntax_error("toml::parse_file: "
                            "newline (or EOF) expected",
                            syntax::newline(ctx.toml_spec()), loc));
                        skip_until_next_table(loc, ctx);
                        continue;
                    }
                }
            }
            else // comment syntax error (rare)
            {
                ctx.report_error(com_res.unwrap_err());
                skip_until_next_table(loc, ctx);
                continue;
            }

            table_format_info fmt;
            fmt.fmt = table_format::multiline;
            fmt.indent_type = indent_char::none;
            auto tab = value_type(table_type{}, std::move(fmt), std::move(com), reg);

            auto inserted = insert_value(inserting_value_kind::std_table,
                std::addressof(root.as_table()),
                key, std::move(reg), std::move(tab));

            if(inserted.is_err())
            {
                ctx.report_error(inserted.unwrap_err());

                // check errors in the table
                auto tmp = basic_value<TC>(table_type());
                auto res = parse_table(loc, ctx, tmp);
                if(res.is_err())
                {
                    ctx.report_error(res.unwrap_err());
                    skip_until_next_table(loc, ctx);
                }
                continue;
            }

            auto tab_ptr = inserted.unwrap();
            assert(tab_ptr);

            const auto tab_res = parse_table(loc, ctx, *tab_ptr);
            if(tab_res.is_err())
            {
                ctx.report_error(tab_res.unwrap_err());
                skip_until_next_table(loc, ctx);
            }
            if(sp.has_value() && sp.value().indent_type != indent_char::none)
            {
                tab_ptr->as_table_fmt().indent_type = sp.value().indent_type;
                tab_ptr->as_table_fmt().name_indent = sp.value().indent;
            }
            continue;
        }

        // does not match array_table nor std_table. report an error.
        const auto keytop = loc;
        const auto maybe_array_of_tables = literal("[[").scan(loc).is_ok();
        loc = keytop;

        if(maybe_array_of_tables)
        {
            ctx.report_error(make_syntax_error("toml::parse_file: invalid array-table key",
                syntax::array_table(spec), loc));
        }
        else
        {
            ctx.report_error(make_syntax_error("toml::parse_file: invalid table key",
                syntax::std_table(spec), loc));
        }
        skip_until_next_table(loc, ctx);
    }

    if( ! ctx.errors().empty())
    {
        return err(std::move(ctx.errors()));
    }
    return ok(std::move(root));
}